

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O2

List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
* __thiscall
Gudhi::persistence_matrix::
List_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
::
multiply_target_and_add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>>>>
          (List_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
           *this,Field_element *val,
          set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>_>
          *column)

{
  if (*val == false) {
    List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
    ::clear((List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
             *)this);
  }
  _add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>>>>
            (this,column);
  return (List_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
          *)this;
}

Assistant:

inline List_column<Master_matrix>& List_column<Master_matrix>::multiply_target_and_add(const Field_element& val,
                                                                                       const Entry_range& column)
{
  static_assert((!Master_matrix::isNonBasic || std::is_same_v<Entry_range, List_column>),
                "For boundary columns, the range has to be a column of same type to help ensure the validity of the "
                "base element.");  // could be removed, if we give the responsibility to the user.
  static_assert((!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type),
                "For chain columns, the given column cannot be constant.");

  if constexpr (Master_matrix::Option_list::is_z2) {
    if (val) {
      _add(column);
    } else {
      clear();
      _add(column);
    }
  } else {
    _multiply_target_and_add(val, column);
  }

  return *this;
}